

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_comp.cpp
# Opt level: O3

void __thiscall crnlib::crn_comp::clear(crn_comp *this)

{
  undefined8 *puVar1;
  vector<unsigned_short> *pvVar2;
  void *pvVar3;
  level_details *p;
  uint *puVar4;
  unsigned_long_long *p_00;
  endpoint_indices_details *p_01;
  selector_indices_details *p_02;
  uchar *puVar5;
  unsigned_short *puVar6;
  bool bVar7;
  pixel_buf_t *ppVar8;
  bool bVar9;
  long lVar10;
  long lVar11;
  symbol_histogram *psVar12;
  
  this->m_pParams = (crn_comp_params *)0x0;
  ppVar8 = &this->m_images[0][0].m_pixel_buf;
  lVar10 = 0;
  do {
    lVar11 = 0;
    do {
      *(undefined8 *)((long)ppVar8 + lVar11 + -8) = 0;
      pvVar3 = *(void **)((long)&ppVar8->m_p + lVar11);
      if (pvVar3 != (void *)0x0) {
        puVar1 = (undefined8 *)((long)&ppVar8->m_p + lVar11);
        crnlib_free(pvVar3);
        *puVar1 = 0;
        puVar1[1] = 0;
      }
      *(undefined8 *)((long)&((image_u8 *)(ppVar8 + -2))->m_width + lVar11) = 0;
      *(undefined8 *)((long)ppVar8 + lVar11 + -0x18) = 0;
      *(undefined4 *)((long)(ppVar8 + -1) + lVar11) = 0xf;
      lVar11 = lVar11 + 0x30;
    } while (lVar11 != 0x300);
    lVar10 = lVar10 + 1;
    ppVar8 = ppVar8 + 0x30;
  } while (lVar10 != 6);
  this->m_has_subblocks = false;
  this->m_has_comp[0] = false;
  this->m_has_comp[1] = false;
  this->m_has_comp[2] = false;
  this->m_has_etc_color_blocks = false;
  p = (this->m_levels).m_p;
  if (p != (level_details *)0x0) {
    crnlib_free(p);
    (this->m_levels).m_p = (level_details *)0x0;
    (this->m_levels).m_size = 0;
    (this->m_levels).m_capacity = 0;
  }
  this->m_total_blocks = 0;
  puVar4 = (this->m_color_endpoints).m_p;
  if (puVar4 != (uint *)0x0) {
    crnlib_free(puVar4);
    (this->m_color_endpoints).m_p = (uint *)0x0;
    (this->m_color_endpoints).m_size = 0;
    (this->m_color_endpoints).m_capacity = 0;
  }
  puVar4 = (this->m_alpha_endpoints).m_p;
  if (puVar4 != (uint *)0x0) {
    crnlib_free(puVar4);
    (this->m_alpha_endpoints).m_p = (uint *)0x0;
    (this->m_alpha_endpoints).m_size = 0;
    (this->m_alpha_endpoints).m_capacity = 0;
  }
  puVar4 = (this->m_color_selectors).m_p;
  if (puVar4 != (uint *)0x0) {
    crnlib_free(puVar4);
    (this->m_color_selectors).m_p = (uint *)0x0;
    (this->m_color_selectors).m_size = 0;
    (this->m_color_selectors).m_capacity = 0;
  }
  p_00 = (this->m_alpha_selectors).m_p;
  if (p_00 != (unsigned_long_long *)0x0) {
    crnlib_free(p_00);
    (this->m_alpha_selectors).m_p = (unsigned_long_long *)0x0;
    (this->m_alpha_selectors).m_size = 0;
    (this->m_alpha_selectors).m_capacity = 0;
  }
  p_01 = (this->m_endpoint_indices).m_p;
  if (p_01 != (endpoint_indices_details *)0x0) {
    crnlib_free(p_01);
    (this->m_endpoint_indices).m_p = (endpoint_indices_details *)0x0;
    (this->m_endpoint_indices).m_size = 0;
    (this->m_endpoint_indices).m_capacity = 0;
  }
  p_02 = (this->m_selector_indices).m_p;
  if (p_02 != (selector_indices_details *)0x0) {
    crnlib_free(p_02);
    (this->m_selector_indices).m_p = (selector_indices_details *)0x0;
    (this->m_selector_indices).m_size = 0;
    (this->m_selector_indices).m_capacity = 0;
  }
  *(undefined8 *)((this->m_crn_header).m_alpha_selectors.m_ofs.m_buf + 1) = 0;
  *(undefined8 *)((this->m_crn_header).m_tables_size.m_buf + 1) = 0;
  *(undefined8 *)((this->m_crn_header).m_color_selectors.m_num.m_buf + 1) = 0;
  *(undefined8 *)((this->m_crn_header).m_alpha_endpoints.m_num.m_buf + 1) = 0;
  *(undefined8 *)((this->m_crn_header).m_userdata1.m_buf + 3) = 0;
  *(undefined8 *)((this->m_crn_header).m_color_endpoints.m_num.m_buf + 1) = 0;
  (this->m_crn_header).m_levels = (uchar  [1])0x0;
  (this->m_crn_header).m_faces = (uchar  [1])0x0;
  (this->m_crn_header).m_format = (uchar  [1])0x0;
  (this->m_crn_header).m_flags = (uchar  [2])0x0;
  (this->m_crn_header).m_reserved.m_buf[0] = '\0';
  (this->m_crn_header).m_reserved.m_buf[1] = '\0';
  (this->m_crn_header).m_reserved.m_buf[2] = '\0';
  *(undefined8 *)((this->m_crn_header).m_reserved.m_buf + 3) = 0;
  (this->m_crn_header).m_sig = (uchar  [2])0x0;
  (this->m_crn_header).m_header_size = (uchar  [2])0x0;
  (this->m_crn_header).m_header_crc16 = (uchar  [2])0x0;
  (this->m_crn_header).m_data_size.m_buf[0] = '\0';
  (this->m_crn_header).m_data_size.m_buf[1] = '\0';
  *(undefined8 *)((this->m_crn_header).m_data_size.m_buf + 2) = 0;
  puVar5 = (this->m_comp_data).m_p;
  if (puVar5 != (uchar *)0x0) {
    crnlib_free(puVar5);
    (this->m_comp_data).m_p = (uchar *)0x0;
    (this->m_comp_data).m_size = 0;
    (this->m_comp_data).m_capacity = 0;
  }
  dxt_hc::clear(&this->m_hvq);
  puVar4 = (this->m_reference_hist).m_hist.m_p;
  if (puVar4 != (uint *)0x0) {
    crnlib_free(puVar4);
    (this->m_reference_hist).m_hist.m_p = (uint *)0x0;
    (this->m_reference_hist).m_hist.m_size = 0;
    (this->m_reference_hist).m_hist.m_capacity = 0;
  }
  static_huffman_data_model::clear(&this->m_reference_dm);
  lVar10 = 0;
  bVar7 = true;
  do {
    bVar9 = bVar7;
    puVar6 = this->m_endpoint_remaping[lVar10].m_p;
    if (puVar6 != (unsigned_short *)0x0) {
      pvVar2 = this->m_endpoint_remaping + lVar10;
      crnlib_free(puVar6);
      pvVar2->m_p = (unsigned_short *)0x0;
      pvVar2->m_size = 0;
      pvVar2->m_capacity = 0;
    }
    puVar4 = this->m_endpoint_index_hist[lVar10].m_hist.m_p;
    if (puVar4 != (uint *)0x0) {
      psVar12 = this->m_endpoint_index_hist + lVar10;
      crnlib_free(puVar4);
      (psVar12->m_hist).m_p = (uint *)0x0;
      (psVar12->m_hist).m_size = 0;
      (psVar12->m_hist).m_capacity = 0;
    }
    static_huffman_data_model::clear
              ((static_huffman_data_model *)
               ((long)this->m_endpoint_index_hist + lVar10 * 0x38 + 0x20));
    puVar6 = this->m_selector_remaping[lVar10].m_p;
    if (puVar6 != (unsigned_short *)0x0) {
      pvVar2 = this->m_selector_remaping + lVar10;
      crnlib_free(puVar6);
      pvVar2->m_p = (unsigned_short *)0x0;
      pvVar2->m_size = 0;
      pvVar2->m_capacity = 0;
    }
    puVar4 = this->m_selector_index_hist[lVar10].m_hist.m_p;
    if (puVar4 != (uint *)0x0) {
      psVar12 = this->m_selector_index_hist + lVar10;
      crnlib_free(puVar4);
      (psVar12->m_hist).m_p = (uint *)0x0;
      (psVar12->m_hist).m_size = 0;
      (psVar12->m_hist).m_capacity = 0;
    }
    static_huffman_data_model::clear
              ((static_huffman_data_model *)
               ((long)this->m_selector_index_hist + lVar10 * 0x38 + 0x20));
    lVar10 = 1;
    bVar7 = false;
  } while (bVar9);
  lVar10 = 0;
  do {
    pvVar3 = *(void **)((long)&this->m_packed_blocks[0].m_p + lVar10);
    if (pvVar3 != (void *)0x0) {
      puVar1 = (undefined8 *)((long)&this->m_packed_blocks[0].m_p + lVar10);
      crnlib_free(pvVar3);
      *puVar1 = 0;
      puVar1[1] = 0;
    }
    lVar10 = lVar10 + 0x10;
  } while (lVar10 != 0x100);
  puVar5 = (this->m_packed_data_models).m_p;
  if (puVar5 != (uchar *)0x0) {
    crnlib_free(puVar5);
    (this->m_packed_data_models).m_p = (uchar *)0x0;
    (this->m_packed_data_models).m_size = 0;
    (this->m_packed_data_models).m_capacity = 0;
  }
  puVar5 = (this->m_packed_color_endpoints).m_p;
  if (puVar5 != (uchar *)0x0) {
    crnlib_free(puVar5);
    (this->m_packed_color_endpoints).m_p = (uchar *)0x0;
    (this->m_packed_color_endpoints).m_size = 0;
    (this->m_packed_color_endpoints).m_capacity = 0;
  }
  puVar5 = (this->m_packed_color_selectors).m_p;
  if (puVar5 != (uchar *)0x0) {
    crnlib_free(puVar5);
    (this->m_packed_color_selectors).m_p = (uchar *)0x0;
    (this->m_packed_color_selectors).m_size = 0;
    (this->m_packed_color_selectors).m_capacity = 0;
  }
  puVar5 = (this->m_packed_alpha_endpoints).m_p;
  if (puVar5 != (uchar *)0x0) {
    crnlib_free(puVar5);
    (this->m_packed_alpha_endpoints).m_p = (uchar *)0x0;
    (this->m_packed_alpha_endpoints).m_size = 0;
    (this->m_packed_alpha_endpoints).m_capacity = 0;
  }
  puVar5 = (this->m_packed_alpha_selectors).m_p;
  if (puVar5 != (uchar *)0x0) {
    crnlib_free(puVar5);
    (this->m_packed_alpha_selectors).m_p = (uchar *)0x0;
    (this->m_packed_alpha_selectors).m_size = 0;
    (this->m_packed_alpha_selectors).m_capacity = 0;
  }
  return;
}

Assistant:

void crn_comp::clear() {
  m_pParams = NULL;

  for (uint f = 0; f < cCRNMaxFaces; f++)
    for (uint l = 0; l < cCRNMaxLevels; l++)
      m_images[f][l].clear();

  utils::zero_object(m_has_comp);
  m_has_etc_color_blocks = false;
  m_has_subblocks = false;

  m_levels.clear();

  m_total_blocks = 0;
  m_color_endpoints.clear();
  m_alpha_endpoints.clear();
  m_color_selectors.clear();
  m_alpha_selectors.clear();
  m_endpoint_indices.clear();
  m_selector_indices.clear();

  utils::zero_object(m_crn_header);

  m_comp_data.clear();

  m_hvq.clear();

  m_reference_hist.clear();
  m_reference_dm.clear();
  for (uint i = 0; i < 2; i++) {
    m_endpoint_remaping[i].clear();
    m_endpoint_index_hist[i].clear();
    m_endpoint_index_dm[i].clear();
    m_selector_remaping[i].clear();
    m_selector_index_hist[i].clear();
    m_selector_index_dm[i].clear();
  }

  for (uint i = 0; i < cCRNMaxLevels; i++)
    m_packed_blocks[i].clear();

  m_packed_data_models.clear();

  m_packed_color_endpoints.clear();
  m_packed_color_selectors.clear();
  m_packed_alpha_endpoints.clear();
  m_packed_alpha_selectors.clear();
}